

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

UChar32 uiter_current32_63(UCharIterator *iter)

{
  uint uVar1;
  uint local_14;
  UChar32 c2;
  UChar32 c;
  UCharIterator *iter_local;
  
  local_14 = (*(code *)iter->current)(iter);
  if ((local_14 & 0xfffff800) == 0xd800) {
    if ((local_14 & 0x400) == 0) {
      (*iter->move)(iter,1,UITER_CURRENT);
      uVar1 = (*(code *)iter->current)(iter);
      if ((uVar1 & 0xfffffc00) == 0xdc00) {
        local_14 = local_14 * 0x400 + uVar1 + 0xfca02400;
      }
      (*iter->move)(iter,-1,UITER_CURRENT);
    }
    else {
      uVar1 = (*(code *)iter->previous)(iter);
      if ((uVar1 & 0xfffffc00) == 0xd800) {
        local_14 = uVar1 * 0x400 + local_14 + 0xfca02400;
      }
      if (-1 < (int)uVar1) {
        (*iter->move)(iter,1,UITER_CURRENT);
      }
    }
  }
  return local_14;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
uiter_current32(UCharIterator *iter) {
    UChar32 c, c2;

    c=iter->current(iter);
    if(U16_IS_SURROGATE(c)) {
        if(U16_IS_SURROGATE_LEAD(c)) {
            /*
             * go to the next code unit
             * we know that we are not at the limit because c!=U_SENTINEL
             */
            iter->move(iter, 1, UITER_CURRENT);
            if(U16_IS_TRAIL(c2=iter->current(iter))) {
                c=U16_GET_SUPPLEMENTARY(c, c2);
            }

            /* undo index movement */
            iter->move(iter, -1, UITER_CURRENT);
        } else {
            if(U16_IS_LEAD(c2=iter->previous(iter))) {
                c=U16_GET_SUPPLEMENTARY(c2, c);
            }
            if(c2>=0) {
                /* undo index movement */
                iter->move(iter, 1, UITER_CURRENT);
            }
        }
    }
    return c;
}